

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_FLTK.cxx
# Opt level: O1

void __thiscall Fl_Native_File_Chooser::Fl_Native_File_Chooser(Fl_Native_File_Chooser *this,int val)

{
  bool bVar1;
  Fl_GTK_File_Chooser *this_00;
  
  this->_btype = val;
  this->_options = 0;
  this->_filter = (char *)0x0;
  this->_parsedfilt = (char *)0x0;
  this->_filtvalue = 0;
  this->_preset_file = (char *)0x0;
  this->_prevvalue = (char *)0x0;
  this->_directory = (char *)0x0;
  this->_errmsg = (char *)0x0;
  if (have_looked_for_GTK_libs == 0) {
    bVar1 = Fl::option(OPTION_FNFC_USES_GTK);
    if (bVar1) {
      Fl_GTK_File_Chooser::probe_for_GTK_libs();
    }
    have_looked_for_GTK_libs = -1;
  }
  if (Fl_GTK_File_Chooser::did_find_GTK_libs == 0) {
    this_00 = (Fl_GTK_File_Chooser *)operator_new(0x58);
    Fl_FLTK_File_Chooser::Fl_FLTK_File_Chooser((Fl_FLTK_File_Chooser *)this_00,val);
  }
  else {
    this_00 = (Fl_GTK_File_Chooser *)operator_new(0x88);
    (this_00->super_Fl_FLTK_File_Chooser)._options = 0;
    (this_00->super_Fl_FLTK_File_Chooser)._nfilters = 0;
    (this_00->super_Fl_FLTK_File_Chooser)._filter = (char *)0x0;
    (this_00->super_Fl_FLTK_File_Chooser)._parsedfilt = (char *)0x0;
    (this_00->super_Fl_FLTK_File_Chooser)._filtvalue = 0;
    (this_00->super_Fl_FLTK_File_Chooser)._preset_file = (char *)0x0;
    (this_00->super_Fl_FLTK_File_Chooser)._prevvalue = (char *)0x0;
    (this_00->super_Fl_FLTK_File_Chooser)._directory = (char *)0x0;
    (this_00->super_Fl_FLTK_File_Chooser)._errmsg = (char *)0x0;
    (this_00->super_Fl_FLTK_File_Chooser)._file_chooser = (Fl_File_Chooser *)0x0;
    (this_00->super_Fl_FLTK_File_Chooser)._vptr_Fl_FLTK_File_Chooser =
         (_func_int **)&PTR__Fl_GTK_File_Chooser_00278a30;
    this_00->gtkw_ptr = (GtkWidget *)0x0;
    this_00->gtkw_slist = (void *)0x0;
    this_00->gtkw_count = 0;
    this_00->gtkw_filename = (char *)0x0;
    this_00->gtkw_title = (char *)0x0;
    (this_00->super_Fl_FLTK_File_Chooser)._btype = val;
    this_00->previous_filter = (char *)0x0;
  }
  (this->field_10)._gtk_file_chooser = this_00;
  return;
}

Assistant:

Fl_Native_File_Chooser::Fl_Native_File_Chooser(int val) {
#if FLTK_ABI_VERSION <= 10302
  _btype       = val;
  _options     = NO_OPTIONS;
  _filter      = NULL;
  _filtvalue   = 0;
  _parsedfilt  = NULL;
  _preset_file = NULL;
  _prevvalue   = NULL;
  _directory   = NULL;
  _errmsg      = NULL;
#endif // FLTK_ABI_VERSION
  if (have_looked_for_GTK_libs == 0) {
    // First Time here, try to find the GTK libs if they are installed
#if HAVE_DLSYM && HAVE_DLFCN_H
    if (Fl::option(Fl::OPTION_FNFC_USES_GTK)) {
      Fl_GTK_File_Chooser::probe_for_GTK_libs();
    }
#endif
    have_looked_for_GTK_libs = -1;
  }
  // if we found all the GTK functions we need, we will use the GtkFileChooserDialog
  if (Fl_GTK_File_Chooser::did_find_GTK_libs) _gtk_file_chooser = new Fl_GTK_File_Chooser(val);
  else _x11_file_chooser = new Fl_FLTK_File_Chooser(val);
}